

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

void soul::ASTUtilities::removeModulesWithSpecialisationParams(Namespace *ns)

{
  iterator __last;
  int iVar1;
  undefined4 extraout_var;
  Namespace *ns_00;
  __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
  __first;
  long *extraout_RDX;
  pool_ref<soul::AST::ModuleBase> *m;
  long *plVar2;
  
  iVar1 = (*(ns->super_ModuleBase).super_ASTObject._vptr_ASTObject[0x18])();
  for (plVar2 = (long *)CONCAT44(extraout_var,iVar1); plVar2 != extraout_RDX; plVar2 = plVar2 + 1) {
    if (*plVar2 == 0) {
      ns_00 = (Namespace *)0x0;
    }
    else {
      ns_00 = (Namespace *)
              __dynamic_cast(*plVar2,&AST::ModuleBase::typeinfo,&AST::Namespace::typeinfo,0);
    }
    if (ns_00 != (Namespace *)0x0) {
      removeModulesWithSpecialisationParams(ns_00);
    }
  }
  __last._M_current =
       (ns->subModules).
       super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>*,std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>,__gnu_cxx::__ops::_Iter_pred<soul::ASTUtilities::removeModulesWithSpecialisationParams(soul::AST::Namespace&)::_lambda(soul::pool_ref<soul::AST::ModuleBase>&)_1_>>
                      ((ns->subModules).
                       super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,__last._M_current);
  if (__first._M_current != __last._M_current) {
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::_M_erase(&ns->subModules,(iterator)__first._M_current,__last);
    return;
  }
  return;
}

Assistant:

static void removeModulesWithSpecialisationParams (AST::Namespace& ns)
    {
        for (auto& m : ns.getSubModules())
            if (auto sub = cast<AST::Namespace> (m))
                removeModulesWithSpecialisationParams (*sub);

        removeIf (ns.subModules,
                  [] (pool_ref<AST::ModuleBase>& m) { return ! m->getSpecialisationParameters().empty(); });
    }